

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport.c
# Opt level: O3

int decrypt(EVP_PKEY_CTX *ctx,uchar *out,size_t *outlen,uchar *in,size_t inlen)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  uchar *puVar4;
  ulong uVar5;
  uchar *__n;
  uchar *puVar6;
  
  iVar1 = *(int *)(*(long *)(ctx + 0x150) + 0x10);
  puVar4 = (uchar *)(long)iVar1;
  if (((*(long *)(ctx + 0x1c0) == 0) || ((*(byte *)(*(long *)(ctx + 0x1c0) + 0x20) & 2) == 0)) &&
     ((long)in % (long)puVar4 != 0)) {
    __assert_fail("(len % blocksize) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sysprogs[P]libssh2/src/transport.c"
                  ,0x8c,
                  "int decrypt(LIBSSH2_SESSION *, unsigned char *, unsigned char *, ssize_t, int)");
  }
  if (0 < (long)in) {
    do {
      __n = puVar4;
      if ((long)in < (long)puVar4) {
        __n = in;
      }
      uVar5 = inlen & 0xffffffff;
      if ((long)puVar4 < (long)in) {
        uVar5 = 0;
      }
      if ((inlen & 1) != 0) {
        uVar5 = 1;
      }
      if (((*(long *)(ctx + 0x1c0) != 0) && ((inlen & 2) != 0)) &&
         (((*(ulong *)(*(long *)(ctx + 0x1c0) + 0x20) & 2) != 0 && ((long)in < (long)(iVar1 * 2)))))
      {
        uVar5 = 2;
        __n = in;
      }
      iVar3 = (**(code **)(*(long *)(ctx + 0x150) + 0x30))(ctx,out,__n,ctx + 0x158,uVar5);
      if (iVar3 != 0) {
        (**(code **)(ctx + 0x18))(*(undefined8 *)(ctx + 0x8b58),ctx);
        return -0xc;
      }
      memcpy(outlen,out,(size_t)__n);
      outlen = (size_t *)((long)outlen + (long)__n);
      out = out + (long)__n;
      puVar6 = in + -(long)__n;
      bVar2 = (long)__n <= (long)in;
      in = puVar6;
    } while (puVar6 != (uchar *)0x0 && bVar2);
  }
  return 0;
}

Assistant:

static int
decrypt(LIBSSH2_SESSION * session, unsigned char *source,
        unsigned char *dest, ssize_t len, int firstlast)
{
    struct transportpacket *p = &session->packet;
    int blocksize = session->remote.crypt->blocksize;

    /* if we get called with a len that isn't an even number of blocksizes
       we risk losing those extra bytes. AAD is an exception, since those first
       few bytes aren't encrypted so it throws off the rest of the count. */
    if(!CRYPT_FLAG_L(session, PKTLEN_AAD))
        assert((len % blocksize) == 0);

    while(len > 0) {
        /* normally decrypt up to blocksize bytes at a time */
        ssize_t decryptlen = LIBSSH2_MIN(blocksize, len);
        /* The first block is special (since it needs to be decoded to get the
           length of the remainder of the block) and takes priority. When the
           length finally gets to the last blocksize bytes, and there's no
           more data to come, it's the end. */
        int lowerfirstlast = IS_FIRST(firstlast) ? FIRST_BLOCK :
            ((len <= blocksize) ? firstlast : MIDDLE_BLOCK);
        /* If the last block would be less than a whole blocksize, combine it
           with the previous block to make it larger. This ensures that the
           whole MAC is included in a single decrypt call. */
        if(CRYPT_FLAG_L(session, PKTLEN_AAD) && IS_LAST(firstlast)
           && (len < blocksize*2)) {
            decryptlen = len;
            lowerfirstlast = LAST_BLOCK;
        }

        if(session->remote.crypt->crypt(session, source, decryptlen,
                                        &session->remote.crypt_abstract,
                                        lowerfirstlast)) {
            LIBSSH2_FREE(session, p->payload);
            return LIBSSH2_ERROR_DECRYPT;
        }

        /* if the crypt() function would write to a given address it
           wouldn't have to memcpy() and we could avoid this memcpy()
           too */
        memcpy(dest, source, decryptlen);

        len -= decryptlen;       /* less bytes left */
        dest += decryptlen;      /* advance write pointer */
        source += decryptlen;    /* advance read pointer */
    }
    return LIBSSH2_ERROR_NONE;         /* all is fine */
}